

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir1.cpp
# Opt level: O0

void __thiscall
Fir1::initWithVector(Fir1 *this,vector<double,_std::allocator<double>_> *_coefficients)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_type sVar3;
  ulong uVar4;
  void *pvVar5;
  reference pvVar6;
  vector<double,_std::allocator<double>_> *in_RSI;
  long *in_RDI;
  unsigned_long i;
  ulong local_18;
  
  sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  *in_RDI = (long)pvVar5;
  sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar3;
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  memset(pvVar5,0,uVar4);
  in_RDI[1] = (long)pvVar5;
  sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  *(int *)(in_RDI + 2) = (int)sVar3;
  local_18 = 0;
  while( true ) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    if (sVar3 <= local_18) break;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,local_18);
    *(value_type *)(*in_RDI + local_18 * 8) = *pvVar6;
    *(undefined8 *)(in_RDI[1] + local_18 * 8) = 0;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void Fir1::initWithVector(std::vector<double> _coefficients) {
	coefficients = new double[_coefficients.size()];
	buffer = new double[_coefficients.size()]();
	taps = ((unsigned int)_coefficients.size());
	for(unsigned long i=0;i<_coefficients.size();i++) {
		coefficients[i] = _coefficients[i];
		buffer[i] = 0;
	}
}